

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O1

int main(int argc,char **argv)

{
  command_info *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_t sVar7;
  FILE *__stream;
  byte *__s;
  byte *__s_00;
  byte *pbVar8;
  byte *pbVar9;
  undefined8 uVar10;
  byte *pbVar11;
  char *pcVar12;
  char *pcVar13;
  byte bVar14;
  command_info *cmdinfo;
  bool bVar15;
  char envr [256];
  char buf [512];
  
  putchar(10);
  iVar4 = PHYSFS_init(*argv);
  if (iVar4 == 0) {
    uVar10 = PHYSFS_getLastError();
    printf("PHYSFS_init() failed!\n  reason: %s.\n",uVar10);
    return 1;
  }
  PHYSFS_getLinkedVersion(buf);
  printf("test_physfs version %d.%d.%d.\n Compiled against PhysicsFS version %d.%d.%d,\n and linked against %d.%d.%d.\n\n"
         ,3,0,0,3,0,0,(ulong)(byte)buf[0],(ulong)(byte)buf[1],(ulong)(byte)buf[2]);
  plVar5 = (long *)PHYSFS_supportedArchiveTypes();
  puts("Supported archive types:");
  puVar6 = (undefined8 *)*plVar5;
  if (puVar6 == (undefined8 *)0x0) {
    puts(" * Apparently, NONE!");
  }
  else {
    do {
      printf(" * %s: %s\n    Written by %s.\n    %s\n",*puVar6,puVar6[1],puVar6[2],puVar6[3]);
      pcVar13 = "Supports";
      if (*(int *)(*plVar5 + 0x20) == 0) {
        pcVar13 = "Does not support";
      }
      printf("    %s symbolic links.\n",pcVar13);
      puVar6 = (undefined8 *)plVar5[1];
      plVar5 = plVar5 + 1;
    } while (puVar6 != (undefined8 *)0x0);
  }
  putchar(10);
  pcVar13 = (char *)PHYSFS_getUserDir();
  strcpy(envr,pcVar13);
  sVar7 = strlen(envr);
  builtin_strncpy(envr + sVar7,".testphys_history",0x12);
  iVar4 = access(envr,0);
  if (iVar4 == 0) {
    __stream = fopen(envr,"r");
    if (__stream == (FILE *)0x0) {
      printf(
            "\n\nCould not open history file [%s] for reading!\n  Will not have past history available.\n\n"
            );
    }
    else {
      do {
        pcVar13 = fgets(buf,0x200,__stream);
        if (pcVar13 == (char *)0x0) break;
        sVar7 = strlen(buf);
        if (buf[sVar7 - 1] == '\n') {
          envr[sVar7 + 0xff] = '\0';
        }
        add_history(buf);
        iVar4 = feof(__stream);
      } while (iVar4 == 0);
      fclose(__stream);
    }
    if (__stream == (FILE *)0x0) goto LAB_001037a5;
  }
  history_file = (FILE *)fopen(envr,"ab");
  if ((FILE *)history_file == (FILE *)0x0) {
    printf(
          "\n\nCould not open history file [%s] for appending!\n  Will not be able to record this session\'s history.\n\n"
          );
  }
LAB_001037a5:
  puts("Enter commands. Enter \"help\" for instructions.");
  fflush(_stdout);
LAB_001037c7:
  __s = (byte *)readline("> ");
  if (__s != (byte *)0x0) {
    sVar7 = strlen((char *)__s);
    __s_00 = (byte *)malloc(sVar7 + 1);
    if (__s_00 == (byte *)0x0) {
      puts("\n\n\nOUT OF MEMORY!\n\n");
      goto LAB_00103884;
    }
    bVar3 = false;
    bVar15 = false;
    pbVar11 = __s_00;
    pbVar9 = __s;
LAB_00103804:
    pbVar8 = pbVar9 + 1;
    bVar14 = *pbVar9;
    pbVar9 = pbVar8;
    if (bVar14 == 0x20) goto LAB_00103823;
    bVar3 = false;
    if (bVar14 != 0) goto LAB_00103816;
    *pbVar11 = 0;
    pcVar13 = strchr((char *)__s_00,0x20);
    if (pcVar13 == (char *)0x0) {
      pcVar13 = (char *)0x0;
    }
    else {
      *pcVar13 = '\0';
      pcVar13 = pcVar13 + 1;
    }
    if (*__s_00 != 0) {
      iVar4 = strcmp("quit",(char *)__s_00);
      if (iVar4 == 0) {
        bVar15 = false;
        cmdinfo = commands;
      }
      else {
        cmdinfo = commands;
        do {
          pcVar1 = cmdinfo + 1;
          bVar15 = pcVar1->cmd == (char *)0x0;
          if (bVar15) goto LAB_0010394e;
          cmdinfo = cmdinfo + 1;
          iVar4 = strcmp(pcVar1->cmd,(char *)__s_00);
        } while (iVar4 != 0);
      }
      if (-1 < cmdinfo->argcount) {
        iVar4 = 0;
        if (pcVar13 != (char *)0x0) {
          bVar3 = false;
          pcVar12 = pcVar13;
          do {
            cVar2 = *pcVar12;
            if (cVar2 == '\"') {
              bVar3 = !bVar3;
            }
            else {
              if (cVar2 == '\0') goto LAB_0010392e;
              iVar4 = iVar4 + (uint)(!bVar3 && cVar2 == ' ');
            }
            pcVar12 = pcVar12 + 1;
          } while( true );
        }
        goto LAB_00103930;
      }
      goto LAB_00103934;
    }
    iVar4 = 1;
    goto LAB_0010399e;
  }
  putchar(10);
LAB_00103884:
  bVar15 = true;
  goto LAB_001039ab;
LAB_00103823:
  if (((*pbVar8 & 0xdf) != 0) && (!bVar3 && bVar15)) {
    bVar3 = true;
    bVar14 = 0x20;
LAB_00103816:
    *pbVar11 = bVar14;
    pbVar11 = pbVar11 + 1;
    bVar15 = true;
  }
  goto LAB_00103804;
LAB_0010392e:
  iVar4 = iVar4 + 1;
LAB_00103930:
  if (iVar4 == cmdinfo->argcount) {
LAB_00103934:
    iVar4 = (*cmdinfo->func)(pcVar13);
  }
  else {
    output_usage("usage:",cmdinfo);
LAB_0010394e:
    iVar4 = 1;
  }
  if (bVar15) {
    puts("Unknown command. Enter \"help\" for instructions.");
  }
  add_history(__s);
  if (history_file != (FILE *)0x0) {
    fprintf((FILE *)history_file,"%s\n",__s);
    fflush((FILE *)history_file);
  }
LAB_0010399e:
  free(__s_00);
  bVar15 = iVar4 == 0;
LAB_001039ab:
  fflush(_stdout);
  if (__s != (byte *)0x0) {
    free(__s);
  }
  if (bVar15) {
    iVar4 = PHYSFS_deinit();
    if (iVar4 == 0) {
      uVar10 = PHYSFS_getLastError();
      printf("PHYSFS_deinit() failed!\n  reason: %s.\n",uVar10);
    }
    if (history_file != (FILE *)0x0) {
      fclose((FILE *)history_file);
    }
    return 0;
  }
  goto LAB_001037c7;
}

Assistant:

int main(int argc, char **argv)
{
    char *buf = NULL;
    int rc = 0;

#if (defined __MWERKS__)
    extern tSIOUXSettings SIOUXSettings;
    SIOUXSettings.asktosaveonclose = 0;
    SIOUXSettings.autocloseonquit = 1;
    SIOUXSettings.rows = 40;
    SIOUXSettings.columns = 120;
#endif

    printf("\n");

    if (!PHYSFS_init(argv[0]))
    {
        printf("PHYSFS_init() failed!\n  reason: %s.\n", PHYSFS_getLastError());
        return 1;
    } /* if */

    output_versions();
    output_archivers();

    open_history_file();

    printf("Enter commands. Enter \"help\" for instructions.\n");
    fflush(stdout);

    do
    {
#if (defined PHYSFS_HAVE_READLINE)
        buf = readline("> ");
#else
        int i;
        buf = (char *) malloc(512);
        memset(buf, '\0', 512);
        printf("> ");
        fflush(stdout);
        for (i = 0; i < 511; i++)
        {
            int ch = fgetc(stdin);
            if (ch == EOF)
            {
                strcpy(buf, "quit");
                break;
            } /* if */
            else if ((ch == '\n') || (ch == '\r'))
            {
                buf[i] = '\0';
                break;
            } /* else if */
            else if (ch == '\b')
            {
                if (i > 0)
                    i--;
            } /* else if */
            else
            {
                buf[i] = (char) ch;
            } /* else */
        } /* for */
#endif

        rc = process_command(buf);
        fflush(stdout);
        if (buf != NULL)
            free(buf);
    } while (rc);

    if (!PHYSFS_deinit())
        printf("PHYSFS_deinit() failed!\n  reason: %s.\n", PHYSFS_getLastError());

    if (history_file)
        fclose(history_file);

/*
    printf("\n\ntest_physfs written by ryan c. gordon.\n");
    printf(" it makes you shoot teh railgun bettar.\n");
*/

    return 0;
}